

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int hash_c_dleqor(PMBTOKEN_METHOD *method,EC_SCALAR *out,EC_AFFINE *X0,EC_AFFINE *X1,EC_AFFINE *T,
                 EC_AFFINE *S,EC_AFFINE *W,EC_AFFINE *K00,EC_AFFINE *K01,EC_AFFINE *K10,
                 EC_AFFINE *K11)

{
  int iVar1;
  size_t local_80;
  size_t len;
  uint8_t *buf;
  CBB cbb;
  int ok;
  EC_AFFINE *S_local;
  EC_AFFINE *T_local;
  EC_AFFINE *X1_local;
  EC_AFFINE *X0_local;
  EC_SCALAR *out_local;
  PMBTOKEN_METHOD *method_local;
  
  cbb.u._28_4_ = 0;
  CBB_zero((CBB *)&buf);
  len = 0;
  iVar1 = CBB_init((CBB *)&buf,0);
  if (((((iVar1 != 0) && (iVar1 = CBB_add_bytes((CBB *)&buf,"DLEQOR2",8), iVar1 != 0)) &&
       (iVar1 = point_to_cbb((CBB *)&buf,method->group,X0), iVar1 != 0)) &&
      (((iVar1 = point_to_cbb((CBB *)&buf,method->group,X1), iVar1 != 0 &&
        (iVar1 = point_to_cbb((CBB *)&buf,method->group,T), iVar1 != 0)) &&
       ((iVar1 = point_to_cbb((CBB *)&buf,method->group,S), iVar1 != 0 &&
        ((iVar1 = point_to_cbb((CBB *)&buf,method->group,W), iVar1 != 0 &&
         (iVar1 = point_to_cbb((CBB *)&buf,method->group,K00), iVar1 != 0)))))))) &&
     ((iVar1 = point_to_cbb((CBB *)&buf,method->group,K01), iVar1 != 0 &&
      ((((iVar1 = point_to_cbb((CBB *)&buf,method->group,K10), iVar1 != 0 &&
         (iVar1 = point_to_cbb((CBB *)&buf,method->group,K11), iVar1 != 0)) &&
        (iVar1 = CBB_finish((CBB *)&buf,(uint8_t **)&len,&local_80), iVar1 != 0)) &&
       (iVar1 = (*method->hash_c)(method->group,out,(uint8_t *)len,local_80), iVar1 != 0)))))) {
    cbb.u._28_4_ = 1;
  }
  CBB_cleanup((CBB *)&buf);
  OPENSSL_free((void *)len);
  return cbb.u._28_4_;
}

Assistant:

static int hash_c_dleqor(const PMBTOKEN_METHOD *method, EC_SCALAR *out,
                         const EC_AFFINE *X0, const EC_AFFINE *X1,
                         const EC_AFFINE *T, const EC_AFFINE *S,
                         const EC_AFFINE *W, const EC_AFFINE *K00,
                         const EC_AFFINE *K01, const EC_AFFINE *K10,
                         const EC_AFFINE *K11) {
  static const uint8_t kDLEQOR2Label[] = "DLEQOR2";

  int ok = 0;
  CBB cbb;
  CBB_zero(&cbb);
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) ||
      !CBB_add_bytes(&cbb, kDLEQOR2Label, sizeof(kDLEQOR2Label)) ||
      !point_to_cbb(&cbb, method->group, X0) ||
      !point_to_cbb(&cbb, method->group, X1) ||
      !point_to_cbb(&cbb, method->group, T) ||
      !point_to_cbb(&cbb, method->group, S) ||
      !point_to_cbb(&cbb, method->group, W) ||
      !point_to_cbb(&cbb, method->group, K00) ||
      !point_to_cbb(&cbb, method->group, K01) ||
      !point_to_cbb(&cbb, method->group, K10) ||
      !point_to_cbb(&cbb, method->group, K11) ||
      !CBB_finish(&cbb, &buf, &len) ||
      !method->hash_c(method->group, out, buf, len)) {
    goto err;
  }

  ok = 1;

err:
  CBB_cleanup(&cbb);
  OPENSSL_free(buf);
  return ok;
}